

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O3

int osx9orBetter(void)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  int V;
  int v;
  char lBuff [1024];
  uint local_420;
  int local_41c;
  char local_418 [1032];
  
  if (-1 < osx9orBetter::lOsx9orBetter) {
    return osx9orBetter::lOsx9orBetter;
  }
  osx9orBetter::lOsx9orBetter = 0;
  __stream = popen("osascript -e \'set osver to system version of (system info)\'","r");
  local_420 = 0;
  pcVar2 = fgets(local_418,0x400,__stream);
  if (pcVar2 != (char *)0x0) {
    iVar1 = __isoc99_sscanf(local_418,"%d.%d",&local_420,&local_41c);
    if ((iVar1 == 2) && (local_420 = local_420 * 100 + local_41c, 0x3f0 < (int)local_420)) {
      osx9orBetter::lOsx9orBetter = 1;
    }
  }
  pclose(__stream);
  if (tinyfd_verbose != 0) {
    printf("Osx10 = %d, %d = %s\n",(ulong)(uint)osx9orBetter::lOsx9orBetter,(ulong)local_420,
           local_418);
  }
  return osx9orBetter::lOsx9orBetter;
}

Assistant:

static int osx9orBetter(void)
{
        static int lOsx9orBetter = -1 ;
        char lBuff[MAX_PATH_OR_CMD] ;
        FILE * lIn ;
        int V,v;

        if ( lOsx9orBetter < 0 )
        {
                lOsx9orBetter = 0 ;
                lIn = popen( "osascript -e 'set osver to system version of (system info)'" , "r" ) ;
                V = 0 ;
                if ( ( fgets( lBuff , sizeof( lBuff ) , lIn ) != NULL )
                        && ( 2 == sscanf(lBuff, "%d.%d", &V, &v) ) )
                {
                        V = V * 100 + v;
                        if ( V >= 1009 )
                        {
                                lOsx9orBetter = 1 ;
                        }
                }
                pclose( lIn ) ;
                if (tinyfd_verbose) printf("Osx10 = %d, %d = %s\n", lOsx9orBetter, V, lBuff) ;
        }
        return lOsx9orBetter ;
}